

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdflib.cpp
# Opt level: O3

double dexpm1(double *x)

{
  double __x;
  double dVar1;
  
  __x = *x;
  if (ABS(__x) <= 0.15) {
    dVar1 = (((__x * 0.0238082361044469 + 9.14041914819518e-10) * __x + 1.0) /
            ((((__x * 0.000595130811860248 + -0.0119041179760821) * __x + 0.107141568980644) * __x +
             -0.499999999085958) * __x + 1.0)) * __x;
  }
  else {
    dVar1 = exp(__x);
    if (__x <= 0.0) {
      dVar1 = dVar1 + -0.5 + -0.5;
    }
    else {
      dVar1 = dVar1 * (-1.0 / dVar1 + 0.5 + 0.5);
    }
  }
  return dVar1;
}

Assistant:

double dexpm1 ( double *x )

//****************************************************************************80
//
//  Purpose:
//
//    DEXPM1 evaluates the function EXP(X) - 1.
//
//  Reference:
//
//    Armido DiDinato and Alfred Morris,
//    Algorithm 708:
//    Significant Digit Computation of the Incomplete Beta Function Ratios,
//    ACM Transactions on Mathematical Software,
//    Volume 18, 1993, pages 360-373.
//
//  Parameters:
//
//    Input, double *X, the value at which exp(X)-1 is desired.
//
//    Output, double DEXPM1, the value of exp(X)-1.
//
{
  static double p1 = .914041914819518e-09;
  static double p2 = .238082361044469e-01;
  static double q1 = -.499999999085958e+00;
  static double q2 = .107141568980644e+00;
  static double q3 = -.119041179760821e-01;
  static double q4 = .595130811860248e-03;
  static double dexpm1;
  double w;

  if ( fabs(*x) <= 0.15e0 )
  {
    dexpm1 =   *x * ( ( (
        p2   * *x
      + p1 ) * *x
      + 1.0e0 )
      /((((
        q4   * *x
      + q3 ) * *x
      + q2 ) * *x
      + q1 ) * *x
      + 1.0e0 ) );
  }
  else if ( *x <= 0.0e0 )
  {
    w = exp(*x);
    dexpm1 = w-0.5e0-0.5e0;
  }
  else
  {
    w = exp(*x);
    dexpm1 = w*(0.5e0+(0.5e0-1.0e0/w));
  }

  return dexpm1;
}